

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateCommonBuilderMethods
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  FieldGenerator *pFVar6;
  FileDescriptor *this_00;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *descriptor_00;
  Descriptor *extraout_RDX_01;
  FileDescriptor *descriptor_01;
  Descriptor *descriptor_02;
  Descriptor *extraout_RDX_02;
  Descriptor *descriptor_03;
  ulong uVar7;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar8;
  undefined8 extraout_RDX_06;
  Descriptor *extraout_RDX_07;
  Descriptor *extraout_RDX_08;
  Descriptor *descriptor_04;
  Descriptor *extraout_RDX_09;
  Descriptor *pDVar9;
  int local_234;
  undefined1 local_230 [4];
  int i_7;
  string local_210;
  string local_1f0;
  string local_1d0;
  uint local_1b0;
  int local_1ac;
  int i_6;
  int i_5;
  uint local_184;
  undefined1 local_180 [4];
  int i_4;
  uint local_15c;
  int local_158;
  int i_3;
  int totalMessageInts;
  int totalBuilderInts;
  FieldGenerator *field;
  int local_140;
  int i_2;
  int totalMessageBits;
  int totalBuilderBits;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  int local_94;
  undefined1 local_90 [4];
  int i_1;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  ClassName_abi_cxx11_(&local_38,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  maybeForceBuilderInitialization();\n}\n\n"
                     ,"classname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = HasDescriptorMethods(this->descriptor_);
  pPVar1 = local_18;
  if (bVar2) {
    ClassName_abi_cxx11_((string *)local_68,(java *)this->descriptor_,descriptor);
    io::Printer::Print(pPVar1,
                       "private Builder(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  super(parent);\n  maybeForceBuilderInitialization();\n}\n"
                       ,"classname",(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
  }
  bVar2 = HasNestedBuilders(this->descriptor_);
  if (bVar2) {
    io::Printer::Print(local_18,
                       "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders) {\n"
                      );
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    for (local_6c = 0; iVar4 = local_6c, iVar3 = Descriptor::field_count(this->descriptor_),
        iVar4 < iVar3; local_6c = local_6c + 1) {
      pFVar5 = Descriptor::field(this->descriptor_,local_6c);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
      (*pFVar6->_vptr_FieldGenerator[0x10])(pFVar6,local_18);
    }
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"  }\n}\n");
    pDVar9 = extraout_RDX;
  }
  else {
    io::Printer::Print(local_18,"private void maybeForceBuilderInitialization() {\n}\n");
    pDVar9 = extraout_RDX_00;
  }
  pPVar1 = local_18;
  ClassName_abi_cxx11_((string *)local_90,(java *)this->descriptor_,pDVar9);
  io::Printer::Print(pPVar1,
                     "private static Builder create() {\n  return new Builder();\n}\n\npublic Builder clear() {\n  super.clear();\n"
                     ,"classname",(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  io::Printer::Indent(local_18);
  for (local_94 = 0; iVar4 = local_94, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar3; local_94 = local_94 + 1) {
    pFVar5 = Descriptor::field(this->descriptor_,local_94);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
    (*pFVar6->_vptr_FieldGenerator[8])(pFVar6,local_18);
  }
  io::Printer::Outdent(local_18);
  pPVar1 = local_18;
  ClassName_abi_cxx11_(&local_b8,(java *)this->descriptor_,descriptor_00);
  io::Printer::Print(pPVar1,
                     "  return this;\n}\n\npublic Builder clone() {\n  return create().mergeFrom(buildPartial());\n}\n\n"
                     ,"classname",&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  bVar2 = HasDescriptorMethods(this->descriptor_);
  pPVar1 = local_18;
  pDVar9 = extraout_RDX_01;
  if (bVar2) {
    this_00 = Descriptor::file(this->descriptor_);
    ClassName_abi_cxx11_(&local_d8,(java *)this_00,descriptor_01);
    (anonymous_namespace)::UniqueFileScopeIdentifier_abi_cxx11_
              (&local_f8,(_anonymous_namespace_ *)this->descriptor_,descriptor_02);
    io::Printer::Print(pPVar1,
                       "public com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                       ,"fileclass",&local_d8,"identifier",&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    pDVar9 = extraout_RDX_02;
  }
  pPVar1 = local_18;
  ClassName_abi_cxx11_(&local_118,(java *)this->descriptor_,pDVar9);
  io::Printer::Print(pPVar1,
                     "public $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
                     ,"classname",&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  pPVar1 = local_18;
  ClassName_abi_cxx11_((string *)&totalMessageBits,(java *)this->descriptor_,descriptor_03);
  io::Printer::Print(pPVar1,
                     "public $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\npublic $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
                     ,"classname",(string *)&totalMessageBits);
  std::__cxx11::string::~string((string *)&totalMessageBits);
  io::Printer::Indent(local_18);
  i_2 = 0;
  local_140 = 0;
  for (field._4_4_ = 0; iVar4 = field._4_4_, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar3; field._4_4_ = field._4_4_ + 1) {
    pFVar5 = Descriptor::field(this->descriptor_,field._4_4_);
    _totalMessageInts = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
    iVar4 = (*_totalMessageInts->_vptr_FieldGenerator[3])();
    i_2 = iVar4 + i_2;
    iVar4 = (*_totalMessageInts->_vptr_FieldGenerator[2])();
    local_140 = iVar4 + local_140;
  }
  i_3 = (i_2 + 0x1f) / 0x20;
  local_158 = (local_140 + 0x1f) / 0x20;
  uVar7 = (long)(local_140 + 0x1f) % 0x20 & 0xffffffff;
  for (local_15c = 0; pPVar1 = local_18, (int)local_15c < i_3; local_15c = local_15c + 1) {
    GetBitFieldName_abi_cxx11_((string *)local_180,(java *)(ulong)local_15c,(int)uVar7);
    io::Printer::Print(pPVar1,"int from_$bit_field_name$ = $bit_field_name$;\n","bit_field_name",
                       (string *)local_180);
    std::__cxx11::string::~string((string *)local_180);
    uVar7 = extraout_RDX_03;
  }
  for (local_184 = 0; pPVar1 = local_18, (int)local_184 < local_158; local_184 = local_184 + 1) {
    GetBitFieldName_abi_cxx11_((string *)&i_6,(java *)(ulong)local_184,(int)uVar7);
    io::Printer::Print(pPVar1,"int to_$bit_field_name$ = 0;\n","bit_field_name",(string *)&i_6);
    std::__cxx11::string::~string((string *)&i_6);
    uVar7 = extraout_RDX_04;
  }
  for (local_1ac = 0; iVar4 = local_1ac, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar3; local_1ac = local_1ac + 1) {
    pFVar5 = Descriptor::field(this->descriptor_,local_1ac);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
    (*pFVar6->_vptr_FieldGenerator[10])(pFVar6,local_18);
  }
  uVar8 = extraout_RDX_05;
  for (local_1b0 = 0; pPVar1 = local_18, (int)local_1b0 < local_158; local_1b0 = local_1b0 + 1) {
    GetBitFieldName_abi_cxx11_(&local_1d0,(java *)(ulong)local_1b0,(int)uVar8);
    io::Printer::Print(pPVar1,"result.$bit_field_name$ = to_$bit_field_name$;\n","bit_field_name",
                       &local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    uVar8 = extraout_RDX_06;
  }
  io::Printer::Outdent(local_18);
  bVar2 = HasDescriptorMethods(this->descriptor_);
  pDVar9 = extraout_RDX_07;
  if (bVar2) {
    io::Printer::Print(local_18,"  onBuilt();\n");
    pDVar9 = extraout_RDX_08;
  }
  pPVar1 = local_18;
  ClassName_abi_cxx11_(&local_1f0,(java *)this->descriptor_,pDVar9);
  io::Printer::Print(pPVar1,"  return result;\n}\n\n","classname",&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar2 = HasGeneratedMethods(this->descriptor_);
  if (bVar2) {
    bVar2 = HasDescriptorMethods(this->descriptor_);
    pPVar1 = local_18;
    pDVar9 = descriptor_04;
    if (bVar2) {
      ClassName_abi_cxx11_(&local_210,(java *)this->descriptor_,descriptor_04);
      io::Printer::Print(pPVar1,
                         "public Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
                         ,"classname",&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      pDVar9 = extraout_RDX_09;
    }
    pPVar1 = local_18;
    ClassName_abi_cxx11_((string *)local_230,(java *)this->descriptor_,pDVar9);
    io::Printer::Print(pPVar1,
                       "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
                       ,"classname",(string *)local_230);
    std::__cxx11::string::~string((string *)local_230);
    io::Printer::Indent(local_18);
    for (local_234 = 0; iVar4 = Descriptor::field_count(this->descriptor_), local_234 < iVar4;
        local_234 = local_234 + 1) {
      pFVar5 = Descriptor::field(this->descriptor_,local_234);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
      (*pFVar6->_vptr_FieldGenerator[9])(pFVar6,local_18);
    }
    io::Printer::Outdent(local_18);
    iVar4 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar4) {
      io::Printer::Print(local_18,"  this.mergeExtensionFields(other);\n");
    }
    bVar2 = HasUnknownFields(this->descriptor_);
    if (bVar2) {
      io::Printer::Print(local_18,"  this.mergeUnknownFields(other.getUnknownFields());\n");
    }
    io::Printer::Print(local_18,"  return this;\n}\n\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
    "// Construct using $classname$.newBuilder()\n"
    "private Builder() {\n"
    "  maybeForceBuilderInitialization();\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
      "private Builder(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  super(parent);\n"
      "  maybeForceBuilderInitialization();\n"
      "}\n",
      "classname", ClassName(descriptor_));
  }


  if (HasNestedBuilders(descriptor_)) {
    printer->Print(
      "private void maybeForceBuilderInitialization() {\n"
      "  if (com.google.protobuf.GeneratedMessage.alwaysUseFieldBuilders) {\n");

    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateFieldBuilderInitializationCode(printer);
    }
    printer->Outdent();
    printer->Outdent();

    printer->Print(
      "  }\n"
      "}\n");
  } else {
    printer->Print(
      "private void maybeForceBuilderInitialization() {\n"
      "}\n");
  }

  printer->Print(
    "private static Builder create() {\n"
    "  return new Builder();\n"
    "}\n"
    "\n"
    "public Builder clear() {\n"
    "  super.clear();\n",
    "classname", ClassName(descriptor_));

  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderClearCode(printer);
  }

  printer->Outdent();

  printer->Print(
    "  return this;\n"
    "}\n"
    "\n"
    "public Builder clone() {\n"
    "  return create().mergeFrom(buildPartial());\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));
  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
      "public com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptorForType() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", ClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  printer->Print(
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return $classname$.getDefaultInstance();\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  // -----------------------------------------------------------------

  printer->Print(
    "public $classname$ build() {\n"
    "  $classname$ result = buildPartial();\n"
    "  if (!result.isInitialized()) {\n"
    "    throw newUninitializedMessageException(result);\n"
    "  }\n"
    "  return result;\n"
    "}\n"
    "\n"
    "public $classname$ buildPartial() {\n"
    "  $classname$ result = new $classname$(this);\n",
    "classname", ClassName(descriptor_));

  printer->Indent();

  // Local vars for from and to bit fields to avoid accessing the builder and
  // message over and over for these fields. Seems to provide a slight
  // perforamance improvement in micro benchmark and this is also what proto1
  // code does.
  int totalBuilderBits = 0;
  int totalMessageBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldGenerator& field = field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
    totalMessageBits += field.GetNumBitsForMessage();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  int totalMessageInts = (totalMessageBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int from_$bit_field_name$ = $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }
  for (int i = 0; i < totalMessageInts; i++) {
    printer->Print("int to_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Output generation code for each field.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i)).GenerateBuildingCode(printer);
  }

  // Copy the bit field results to the generated message
  for (int i = 0; i < totalMessageInts; i++) {
    printer->Print("result.$bit_field_name$ = to_$bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  printer->Outdent();

  if (HasDescriptorMethods(descriptor_)) {
    printer->Print(
    "  onBuilt();\n");
  }

  printer->Print(
    "  return result;\n"
    "}\n"
    "\n",
    "classname", ClassName(descriptor_));

  // -----------------------------------------------------------------

  if (HasGeneratedMethods(descriptor_)) {
    // MergeFrom(Message other) requires the ability to distinguish the other
    // messages type by its descriptor.
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
        "  if (other instanceof $classname$) {\n"
        "    return mergeFrom(($classname$)other);\n"
        "  } else {\n"
        "    super.mergeFrom(other);\n"
        "    return this;\n"
        "  }\n"
        "}\n"
        "\n",
        "classname", ClassName(descriptor_));
    }

    printer->Print(
      "public Builder mergeFrom($classname$ other) {\n"
      // Optimization:  If other is the default instance, we know none of its
      //   fields are set so we can skip the merge.
      "  if (other == $classname$.getDefaultInstance()) return this;\n",
      "classname", ClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i)).GenerateMergingCode(printer);
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print(
        "  this.mergeExtensionFields(other);\n");
    }

    if (HasUnknownFields(descriptor_)) {
      printer->Print(
        "  this.mergeUnknownFields(other.getUnknownFields());\n");
    }

    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }
}